

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O2

char * archive_nettle_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_nettle_version(void)
{
#if defined(ARCHIVE_CRYPTOR_USE_NETTLE) || defined(ARCHIVE_CRYPTO_NETTLE)
	static char nettle_version[6];
	snprintf(nettle_version, 6, "%d.%d", nettle_version_major(), nettle_version_minor());
	return nettle_version;
#else
	return NULL;
#endif
}